

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_device.c
# Opt level: O0

int is_timeout_reached(time_t start_time,uint timeout_in_secs,_Bool *is_timed_out)

{
  LOGGER_LOG p_Var1;
  time_t stopTime;
  double dVar2;
  LOGGER_LOG l_2;
  time_t current_time;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  _Bool *is_timed_out_local;
  uint timeout_in_secs_local;
  time_t start_time_local;
  
  if (start_time == -1) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                ,"is_timeout_reached",0xeb,1,"Failed to verify timeout (start_time is INDEFINITE)");
    }
    l._4_4_ = 0xec;
  }
  else if (is_timed_out == (_Bool *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                ,"is_timeout_reached",0xf0,1,"Failed to verify timeout (is_timed_out is NULL)");
    }
    l._4_4_ = 0xf1;
  }
  else {
    stopTime = get_time((time_t *)0x0);
    if (stopTime == -1) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                  ,"is_timeout_reached",0xf9,1,"Failed to verify timeout (get_time failed)");
      }
      l._4_4_ = 0xfa;
    }
    else {
      dVar2 = get_difftime(stopTime,start_time);
      if (dVar2 < (double)timeout_in_secs) {
        *is_timed_out = false;
      }
      else {
        *is_timed_out = true;
      }
      l._4_4_ = 0;
    }
  }
  return l._4_4_;
}

Assistant:

static int is_timeout_reached(time_t start_time, size_t timeout_in_secs, int *is_timed_out)
{
    int result;

    if (start_time == INDEFINITE_TIME)
    {
        LogError("Failed to verify timeout (start_time is INDEFINITE)");
        result = MU_FAILURE;
    }
    else
    {
        time_t current_time;

        if ((current_time = get_time(NULL)) == INDEFINITE_TIME)
        {
            LogError("Failed to verify timeout (get_time failed)");
            result = MU_FAILURE;
        }
        else
        {
            if (get_difftime(current_time, start_time) >= timeout_in_secs)
            {
                *is_timed_out = 1;
            }
            else
            {
                *is_timed_out = 0;
            }

            result = RESULT_OK;
        }
    }

    return result;
}